

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cached-file.c
# Opt level: O3

void lwsac_use_cached_file_end(lwsac_cached_file_t *cache)

{
  lwsac_cached_file_t puVar1;
  long lVar2;
  int iVar3;
  lwsac *lac;
  lwsac *local_18;
  
  if (cache != (lwsac_cached_file_t *)0x0) {
    puVar1 = *cache;
    if (puVar1 != (lwsac_cached_file_t)0x0) {
      local_18 = (lwsac *)(puVar1 + -0xd8);
      lVar2 = *(long *)(puVar1 + -0xd0);
      iVar3 = *(int *)(lVar2 + 0x30);
      if (iVar3 == 0) {
        _lws_log(1,"%s: html refcount zero on entry\n","lwsac_use_cached_file_end");
        iVar3 = *(int *)(lVar2 + 0x30);
        if (iVar3 == 0) {
          return;
        }
      }
      *(int *)(lVar2 + 0x30) = iVar3 + -1;
      if ((iVar3 + -1 == 0) && (*(char *)(lVar2 + 0x38) != '\0')) {
        *cache = (lwsac_cached_file_t)0x0;
        lwsac_free(&local_18);
      }
    }
  }
  return;
}

Assistant:

void
lwsac_use_cached_file_end(lwsac_cached_file_t *cache)
{
	struct lwsac *lac;
	struct lwsac_head *lachead;

	if (!cache || !*cache)
		return;

	lac = cache_file_to_lac(*cache);
	lachead = (struct lwsac_head *)&lac->head[1];

	if (!lachead->refcount)
		lwsl_err("%s: html refcount zero on entry\n", __func__);

	if (lachead->refcount && !--lachead->refcount && lachead->detached) {
		*cache = NULL; /* not usable any more */
		lwsac_free(&lac);
	}
}